

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O3

void t6(void)

{
  int iVar1;
  
  puts("Trigger tests.");
  gpio_write(0x19,0);
  callback(0x19,2,t6cbf);
  time_sleep(0x3fc999999999999a);
  iVar1 = 10;
  do {
    time_sleep(0x3fb999999999999a);
    gpio_trigger(0x19,iVar1,1);
    iVar1 = iVar1 + 10;
  } while (iVar1 != 0x3c);
  time_sleep(0x3fe0000000000000);
  CHECK(6,1,t6_count,5,0,"gpio trigger count");
  CHECK(6,2,t6_on,0x96,0x19,"gpio trigger pulse length");
  return;
}

Assistant:

void t6()
{
   int tp, t, p;

   printf("Trigger tests.\n");

   gpio_write(GPIO, PI_LOW);

   tp = 0;

   callback(GPIO, EITHER_EDGE, t6cbf);

   time_sleep(0.2);

   for (t=0; t<5; t++)
   {
      time_sleep(0.1);
      p = 10 + (t*10);
      tp += p;
      gpio_trigger(GPIO, p, 1);
   }

   time_sleep(0.5);

   CHECK(6, 1, t6_count, 5, 0, "gpio trigger count");

   CHECK(6, 2, t6_on, tp, 25, "gpio trigger pulse length");
}